

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

void deleteEmptyEdges(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v)

{
  iterator iVar1;
  iterator __first;
  __normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_RDI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffa8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd0;
  
  iVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                    (in_stack_ffffffffffffffa8);
  __first = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                      (in_stack_ffffffffffffffa8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,deleteEmptyEdges(std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&)::__0>
            (iVar1._M_current,__first._M_current);
  __gnu_cxx::
  __normal_iterator<PhyloTreeEdge_const*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>::
  __normal_iterator<PhyloTreeEdge*>
            (in_RDI,(__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                     *)in_stack_ffffffffffffffa8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffffa8);
  __gnu_cxx::
  __normal_iterator<PhyloTreeEdge_const*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>::
  __normal_iterator<PhyloTreeEdge*>
            (in_RDI,(__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                     *)in_stack_ffffffffffffffa8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::erase
            (in_stack_ffffffffffffffc8,(const_iterator)__first._M_current,in_stack_ffffffffffffffd0)
  ;
  return;
}

Assistant:

void deleteEmptyEdges(vector<PhyloTreeEdge> &v) {
    v.erase(std::remove_if(v.begin(), v.end(), [](PhyloTreeEdge &element) {
        return element.isEmpty();
    }), v.end());
}